

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistent_cohomology.h
# Opt level: O3

void __thiscall
Gudhi::persistent_cohomology::
Persistent_cohomology<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,_Gudhi::persistent_cohomology::Field_Zp>
::update_cohomology_groups_edge
          (Persistent_cohomology<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,_Gudhi::persistent_cohomology::Field_Zp>
           *this,Simplex_handle *sigma)

{
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  *this_00;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  uint *puVar5;
  int *piVar6;
  pointer pvVar7;
  pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>
  *ppVar8;
  pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>
  *ppVar9;
  iterator __it;
  key_type_conflict *pkVar10;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> __it_00;
  key_type_conflict *pkVar11;
  mapped_type *pmVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  Filtration_value *pFVar17;
  ulong uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  bool bVar22;
  Simplex_key ku;
  Simplex_key kv;
  uint local_70;
  uint local_6c;
  Simplex_handle *local_68;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_60;
  pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>
  *local_58;
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>
  local_50;
  size_type local_48;
  __node_base local_40;
  pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>
  *local_38;
  
  local_38 = sigma->m_ptr;
  local_68 = sigma;
  Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::endpoints
            ((Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *)&stack0xffffffffffffffb0,
             (Simplex_handle *)this->cpx_);
  uVar20 = ((local_50.m_ptr)->second).super_Key_simplex_base.key_;
  uVar16 = (ulong)uVar20;
  puVar5 = (this->dsets_).parent;
  uVar13 = puVar5[uVar16];
  uVar19 = uVar13;
  uVar14 = uVar16;
  if (uVar13 != uVar20) {
    do {
      uVar14 = (ulong)uVar19;
      bVar22 = puVar5[uVar19] != uVar19;
      uVar19 = puVar5[uVar19];
    } while (bVar22);
  }
  for (; local_70 = (uint)uVar14, local_70 != uVar13; uVar13 = puVar5[uVar13]) {
    puVar5[uVar16] = local_70;
    uVar16 = (ulong)uVar13;
  }
  uVar18 = (ulong)*(uint *)(local_48 + 0xc);
  uVar20 = puVar5[uVar18];
  uVar16 = uVar18;
  uVar13 = uVar20;
  if (uVar20 != *(uint *)(local_48 + 0xc)) {
    do {
      uVar16 = (ulong)uVar13;
      bVar22 = puVar5[uVar13] != uVar13;
      uVar13 = puVar5[uVar13];
    } while (bVar22);
  }
  for (; local_6c = (uint)uVar16, local_6c != uVar20; uVar20 = puVar5[uVar20]) {
    puVar5[uVar18] = local_6c;
    uVar18 = (ulong)uVar20;
  }
  if (local_70 == local_6c) {
    if (this->dim_max_ < 2) {
      return;
    }
    local_40._M_nxt = (_Hash_node_base *)local_68->m_ptr;
    create_cocycle(this,(Simplex_handle *)&stack0xffffffffffffffc0,1,(this->coeff_field_).Prime);
    return;
  }
  uVar20 = puVar5[uVar14];
  uVar13 = uVar20;
  uVar19 = local_70;
  if (uVar20 != local_70) {
    do {
      uVar19 = uVar13;
      uVar13 = puVar5[uVar19];
    } while (puVar5[uVar19] != uVar19);
  }
  piVar6 = (this->dsets_).rank;
  for (; uVar19 != uVar20; uVar20 = puVar5[uVar20]) {
    puVar5[uVar14] = uVar19;
    uVar14 = (ulong)uVar20;
  }
  uVar20 = puVar5[uVar16];
  uVar14 = uVar16;
  uVar13 = uVar20;
  if (uVar20 != local_6c) {
    do {
      uVar14 = (ulong)uVar13;
      bVar22 = puVar5[uVar13] != uVar13;
      uVar13 = puVar5[uVar13];
    } while (bVar22);
  }
  for (; uVar13 = (uint)uVar14, uVar13 != uVar20; uVar20 = puVar5[uVar20]) {
    puVar5[uVar16] = uVar13;
    uVar16 = (ulong)uVar20;
  }
  if (uVar19 != uVar13) {
    if (piVar6[uVar14] < piVar6[uVar19]) {
      puVar5[uVar14] = uVar19;
    }
    else {
      puVar5[uVar19] = uVar13;
      if (piVar6[uVar19] == piVar6[uVar14]) {
        piVar6[uVar14] = piVar6[uVar19] + 1;
      }
    }
  }
  this_00 = &this->zero_cocycles_;
  __it = std::
         _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
         ::find(&this_00->_M_h,&local_70);
  pkVar10 = (key_type_conflict *)
            ((long)__it.
                   super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
                   _M_cur + 0xc);
  if (__it.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur ==
      (__node_type *)0x0) {
    pkVar10 = &local_70;
  }
  uVar20 = *pkVar10;
  uVar14 = (ulong)uVar20;
  pkVar10 = &local_6c;
  local_60 = &this_00->_M_h;
  __it_00._M_cur =
       (__node_type *)
       std::
       _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
       ::find(&this_00->_M_h,pkVar10);
  pkVar11 = (key_type_conflict *)((long)__it_00._M_cur + 0xc);
  if (__it_00._M_cur == (__node_type *)0x0) {
    pkVar11 = pkVar10;
  }
  uVar13 = *pkVar11;
  uVar16 = (ulong)uVar13;
  pvVar7 = (this->cpx_->filtration_vect_).
           super__Vector_base<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar8 = pvVar7[uVar14].m_ptr;
  pFVar17 = (Filtration_value *)&ppVar8->second;
  if (ppVar8 == (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>
                 *)0x0) {
    pFVar17 = &Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::
               Filtration_simplex_base_real::inf_;
  }
  fVar1 = (((Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>
             *)pFVar17)->super_Filtration_simplex_base).filt_;
  ppVar9 = pvVar7[uVar16].m_ptr;
  pFVar17 = (Filtration_value *)&ppVar9->second;
  if (ppVar9 == (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>
                 *)0x0) {
    pFVar17 = &Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::
               Filtration_simplex_base_real::inf_;
  }
  fVar2 = (((Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>
             *)pFVar17)->super_Filtration_simplex_base).filt_;
  pFVar17 = (Filtration_value *)&local_68->m_ptr->second;
  if (local_68->m_ptr ==
      (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>
       *)0x0) {
    pFVar17 = &Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::
               Filtration_simplex_base_real::inf_;
  }
  fVar3 = (((Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>
             *)pFVar17)->super_Filtration_simplex_base).filt_;
  fVar4 = (this->interval_length_policy).min_length_;
  if (fVar2 <= fVar1) {
    if (fVar4 < fVar3 - fVar1) {
      local_58 = (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>
                  *)CONCAT44(local_58._4_4_,(this->coeff_field_).Prime);
      local_50.m_ptr = ppVar8;
      std::
      vector<std::tuple<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,int>,std::allocator<std::tuple<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,int>>>
      ::
      emplace_back<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>&,int>
                ((vector<std::tuple<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,int>,std::allocator<std::tuple<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,int>>>
                  *)&this->persistent_pairs_,&stack0xffffffffffffffb0,local_68,(int *)&local_58);
    }
    if (local_70 != uVar20) {
      std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::erase(local_60,(const_iterator)
                       __it.
                       super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                       ._M_cur);
      uVar14 = (ulong)local_70;
    }
    puVar5 = (this->dsets_).parent;
    uVar20 = puVar5[uVar14];
    uVar21 = (uint)uVar14;
    uVar19 = uVar20;
    uVar15 = uVar21;
    if (uVar20 != uVar21) {
      do {
        uVar15 = uVar19;
        uVar19 = puVar5[uVar15];
      } while (puVar5[uVar15] != uVar15);
    }
    for (; uVar15 != uVar20; uVar20 = puVar5[uVar20]) {
      puVar5[uVar14] = uVar15;
      uVar14 = (ulong)uVar20;
    }
    if (uVar21 != uVar15) goto LAB_00115cbd;
    pkVar10 = &local_70;
    uVar20 = uVar13;
    if (local_6c != uVar13) goto LAB_00115c9d;
  }
  else {
    if (fVar4 < fVar3 - fVar2) {
      local_58 = (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>
                  *)CONCAT44(local_58._4_4_,(this->coeff_field_).Prime);
      local_50.m_ptr = ppVar9;
      std::
      vector<std::tuple<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,int>,std::allocator<std::tuple<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,int>>>
      ::
      emplace_back<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>&,int>
                ((vector<std::tuple<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,int>,std::allocator<std::tuple<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,int>>>
                  *)&this->persistent_pairs_,&stack0xffffffffffffffb0,local_68,(int *)&local_58);
    }
    if (local_6c != uVar13) {
      std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::erase(local_60,(const_iterator)__it_00._M_cur);
      uVar16 = (ulong)local_6c;
    }
    puVar5 = (this->dsets_).parent;
    uVar13 = puVar5[uVar16];
    uVar21 = (uint)uVar16;
    uVar19 = uVar13;
    uVar15 = uVar21;
    if (uVar13 != uVar21) {
      do {
        uVar15 = uVar19;
        uVar19 = puVar5[uVar15];
      } while (puVar5[uVar15] != uVar15);
    }
    for (; uVar15 != uVar13; uVar13 = puVar5[uVar13]) {
      puVar5[uVar16] = uVar15;
      uVar16 = (ulong)uVar13;
    }
    if (uVar21 != uVar15) goto LAB_00115cbd;
    __it_00 = __it.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
              _M_cur;
    uVar13 = uVar20;
    if (local_70 != uVar20) {
LAB_00115c9d:
      std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::erase(local_60,(const_iterator)__it_00._M_cur);
      uVar20 = uVar13;
    }
  }
  pmVar12 = std::__detail::
            _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)local_60,pkVar10);
  *pmVar12 = uVar20;
LAB_00115cbd:
  local_58 = local_68->m_ptr;
  Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::_to_node_it
            ((Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *)&stack0xffffffffffffffb0,
             (Simplex_handle *)this->cpx_);
  ((local_50.m_ptr)->second).super_Key_simplex_base.key_ = 0xffffffff;
  return;
}

Assistant:

void update_cohomology_groups_edge(Simplex_handle sigma) {
    Simplex_handle u, v;
    boost::tie(u, v) = cpx_->endpoints(sigma);

    Simplex_key ku = dsets_.find_set(cpx_->key(u));
    Simplex_key kv = dsets_.find_set(cpx_->key(v));

    if (ku != kv) {        // Destroy a connected component
      dsets_.link(ku, kv);
      // Keys of the simplices which created the connected components containing
      // respectively u and v.
      Simplex_key idx_coc_u, idx_coc_v;
      auto map_it_u = zero_cocycles_.find(ku);
      // If the index of the cocycle representing the class is already ku.
      if (map_it_u == zero_cocycles_.end()) {
        idx_coc_u = ku;
      } else {
        idx_coc_u = map_it_u->second;
      }

      auto map_it_v = zero_cocycles_.find(kv);
      // If the index of the cocycle representing the class is already kv.
      if (map_it_v == zero_cocycles_.end()) {
        idx_coc_v = kv;
      } else {
        idx_coc_v = map_it_v->second;
      }

      if (cpx_->filtration(cpx_->simplex(idx_coc_u))
          < cpx_->filtration(cpx_->simplex(idx_coc_v))) {  // Kill cocycle [idx_coc_v], which is younger.
        if (interval_length_policy(cpx_->simplex(idx_coc_v), sigma)) {
          persistent_pairs_.emplace_back(
              cpx_->simplex(idx_coc_v), sigma, coeff_field_.characteristic());
        }
        // Maintain the index of the 0-cocycle alive.
        if (kv != idx_coc_v) {
          zero_cocycles_.erase(map_it_v);
        }
        if (kv == dsets_.find_set(kv)) {
          if (ku != idx_coc_u) {
            zero_cocycles_.erase(map_it_u);
          }
          zero_cocycles_[kv] = idx_coc_u;
        }
      } else {  // Kill cocycle [idx_coc_u], which is younger.
        if (interval_length_policy(cpx_->simplex(idx_coc_u), sigma)) {
          persistent_pairs_.emplace_back(
              cpx_->simplex(idx_coc_u), sigma, coeff_field_.characteristic());
        }
        // Maintain the index of the 0-cocycle alive.
        if (ku != idx_coc_u) {
          zero_cocycles_.erase(map_it_u);
        }
        if (ku == dsets_.find_set(ku)) {
          if (kv != idx_coc_v) {
            zero_cocycles_.erase(map_it_v);
          }
          zero_cocycles_[ku] = idx_coc_v;
        }
      }
      cpx_->assign_key(sigma, cpx_->null_key());
    } else if (dim_max_ > 1) {  // If ku == kv, same connected component: create a 1-cocycle class.
      create_cocycle(sigma, coeff_field_.multiplicative_identity(), coeff_field_.characteristic());
    }
  }